

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OrderMoney.cpp
# Opt level: O0

void __thiscall OrderMoney::OrderMoney(OrderMoney *this,shared_ptr<const_Money> *a)

{
  element_type *peVar1;
  string local_50 [36];
  undefined1 local_2c [28];
  shared_ptr<const_Money> *a_local;
  OrderMoney *this_local;
  
  local_2c._20_8_ = a;
  a_local = (shared_ptr<const_Money> *)this;
  Money::Money(&this->super_Money);
  (this->super_Money)._vptr_Money = (_func_int **)&PTR__OrderMoney_00168218;
  std::shared_ptr<const_Money>::shared_ptr(&this->a,(shared_ptr<const_Money> *)local_2c._20_8_);
  local_2c._0_4_ = 0;
  peVar1 = std::__shared_ptr_access<const_Money,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<const_Money,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      local_2c._20_8_);
  (*peVar1->_vptr_Money[3])(local_50);
  std::make_shared<RealMoney,int,std::__cxx11::string>
            ((int *)(local_2c + 4),
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2c);
  std::shared_ptr<Money_const>::shared_ptr<RealMoney,void>
            ((shared_ptr<Money_const> *)&this->b,(shared_ptr<RealMoney> *)(local_2c + 4));
  std::shared_ptr<RealMoney>::~shared_ptr((shared_ptr<RealMoney> *)(local_2c + 4));
  std::__cxx11::string::~string(local_50);
  return;
}

Assistant:

OrderMoney::OrderMoney(const shared_ptr<const Money> &a)
	: a(a), b(make_shared<RealMoney>(0, a->currency()))
{
}